

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O3

char * duckdb_shell_sqlite3_column_decltype(sqlite3_stmt *pStmt,int iCol)

{
  ulong __n;
  pointer this;
  vector<duckdb::LogicalType,_true> *this_00;
  pointer pPVar1;
  const_reference other;
  ulong uVar2;
  char *pcVar3;
  value_type column_type;
  LogicalType local_20;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    return (char *)0x0;
  }
  __n = (ulong)(uint)iCol;
  if ((pStmt->prepared).
      super_unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PreparedStatement_*,_std::default_delete<duckdb::PreparedStatement>_>
      .super__Head_base<0UL,_duckdb::PreparedStatement_*,_false>._M_head_impl ==
      (PreparedStatement *)0x0) {
    if ((pStmt->pending).
        super_unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PendingQueryResult_*,_std::default_delete<duckdb::PendingQueryResult>_>
        .super__Head_base<0UL,_duckdb::PendingQueryResult_*,_false>._M_head_impl ==
        (PendingQueryResult *)0x0) {
      return (char *)0x0;
    }
    pPVar1 = duckdb::
             unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
             ::operator->(&pStmt->pending);
    this_00 = &(pPVar1->super_BaseQueryResult).types;
  }
  else {
    this = duckdb::
           unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
           ::operator->(&pStmt->prepared);
    this_00 = duckdb::PreparedStatement::GetTypes(this);
  }
  if (iCol < 0) {
    return (char *)0x0;
  }
  uVar2 = ((long)(this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar2 < __n || uVar2 - __n == 0) {
    return (char *)0x0;
  }
  other = duckdb::vector<duckdb::LogicalType,_true>::operator[](this_00,__n);
  duckdb::LogicalType::LogicalType(&local_20,other);
  if (local_20.id_ < STRUCT) {
    switch(local_20.id_) {
    case BOOLEAN:
      pcVar3 = "BOOLEAN";
      break;
    case TINYINT:
      pcVar3 = "TINYINT";
      break;
    case SMALLINT:
      pcVar3 = "SMALLINT";
      break;
    case INTEGER:
      pcVar3 = "INTEGER";
      break;
    case BIGINT:
      pcVar3 = "BIGINT";
      break;
    case DATE:
      pcVar3 = "DATE";
      break;
    case TIME:
      pcVar3 = "TIME";
      break;
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
    case TIMESTAMP:
    case TIMESTAMP_NS:
      pcVar3 = "TIMESTAMP";
      break;
    case DECIMAL:
      pcVar3 = "DECIMAL";
      break;
    case FLOAT:
      pcVar3 = "FLOAT";
      break;
    case DOUBLE:
      pcVar3 = "DOUBLE";
      break;
    default:
      goto switchD_00cfbeec_caseD_18;
    case VARCHAR:
      pcVar3 = "VARCHAR";
      break;
    case BLOB:
      pcVar3 = "BLOB";
    }
  }
  else {
    if (local_20.id_ == STRUCT) {
      pcVar3 = "STRUCT";
      goto LAB_00cfbfac;
    }
    if (local_20.id_ == LIST) {
      pcVar3 = "LIST";
      goto LAB_00cfbfac;
    }
    if (local_20.id_ == MAP) {
      pcVar3 = "MAP";
      goto LAB_00cfbfac;
    }
switchD_00cfbeec_caseD_18:
    pcVar3 = (char *)0x0;
  }
LAB_00cfbfac:
  duckdb::LogicalType::~LogicalType(&local_20);
  return pcVar3;
}

Assistant:

const char *sqlite3_column_decltype(sqlite3_stmt *pStmt, int iCol) {
	if (!pStmt) {
		return nullptr;
	}

	const duckdb::vector<LogicalType> *types;
	if (pStmt->prepared) {
		types = &pStmt->prepared->GetTypes();
	} else if (pStmt->pending) {
		types = &pStmt->pending->types;
	} else {
		return nullptr;
	}
	if (iCol < 0 || types->size() <= static_cast<size_t>(iCol)) {
		return nullptr;
	}

	auto column_type = (*types)[iCol];
	switch (column_type.id()) {
	case LogicalTypeId::BOOLEAN:
		return "BOOLEAN";
	case LogicalTypeId::TINYINT:
		return "TINYINT";
	case LogicalTypeId::SMALLINT:
		return "SMALLINT";
	case LogicalTypeId::INTEGER:
		return "INTEGER";
	case LogicalTypeId::BIGINT:
		return "BIGINT";
	case LogicalTypeId::FLOAT:
		return "FLOAT";
	case LogicalTypeId::DOUBLE:
		return "DOUBLE";
	case LogicalTypeId::DECIMAL:
		return "DECIMAL";
	case LogicalTypeId::DATE:
		return "DATE";
	case LogicalTypeId::TIME:
		return "TIME";
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_SEC:
		return "TIMESTAMP";
	case LogicalTypeId::VARCHAR:
		return "VARCHAR";
	case LogicalTypeId::LIST:
		return "LIST";
	case LogicalTypeId::MAP:
		return "MAP";
	case LogicalTypeId::STRUCT:
		return "STRUCT";
	case LogicalTypeId::BLOB:
		return "BLOB";
	default:
		return NULL;
	}
	return NULL;
}